

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::Scrollbar(ImGuiAxis axis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiWindow *window;
  ImDrawCornerFlags rounding_corners;
  ImGuiID id;
  float *pfVar5;
  size_t idx;
  bool bVar6;
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar9 [64];
  ImRect IVar11;
  ImRect bb;
  ImRect local_40;
  undefined1 auVar8 [56];
  undefined1 auVar10 [56];
  
  auVar10 = in_ZMM1._8_56_;
  auVar8 = in_ZMM0._8_56_;
  window = GImGui->CurrentWindow;
  id = GetWindowScrollbarID(window,axis);
  KeepAliveID(id);
  IVar11 = GetWindowScrollbarRect(window,axis);
  auVar9._0_8_ = IVar11.Max;
  auVar9._8_56_ = auVar10;
  auVar7._0_8_ = IVar11.Min;
  auVar7._8_56_ = auVar8;
  local_40 = (ImRect)vmovlhps_avx(auVar7._0_16_,auVar9._0_16_);
  if (axis == ImGuiAxis_X) {
    rounding_corners = (window->ScrollbarY ^ 1) * 8 + 4;
  }
  else {
    bVar6 = (window->Flags & 0x401U) == 1;
    rounding_corners = (uint)bVar6 * 2 + 8;
    if (window->ScrollbarX != false) {
      rounding_corners = (uint)bVar6 * 2;
    }
  }
  idx = (size_t)axis;
  pfVar5 = ImVec2::operator[](&(window->InnerRect).Max,idx);
  fVar1 = *pfVar5;
  pfVar5 = ImVec2::operator[](&(window->InnerRect).Min,idx);
  fVar2 = *pfVar5;
  pfVar5 = ImVec2::operator[](&window->ContentSize,idx);
  fVar3 = *pfVar5;
  pfVar5 = ImVec2::operator[](&window->WindowPadding,idx);
  fVar4 = *pfVar5;
  pfVar5 = ImVec2::operator[](&window->Scroll,idx);
  ScrollbarEx(&local_40,id,axis,pfVar5,fVar1 - fVar2,fVar4 + fVar4 + fVar3,rounding_corners);
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    ImRect bb = GetWindowScrollbarRect(window, axis);
    ImDrawCornerFlags rounding_corners = 0;
    if (axis == ImGuiAxis_X)
    {
        rounding_corners |= ImDrawCornerFlags_BotLeft;
        if (!window->ScrollbarY)
            rounding_corners |= ImDrawCornerFlags_BotRight;
    }
    else
    {
        if ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar))
            rounding_corners |= ImDrawCornerFlags_TopRight;
        if (!window->ScrollbarX)
            rounding_corners |= ImDrawCornerFlags_BotRight;
    }
    float size_avail = window->InnerRect.Max[axis] - window->InnerRect.Min[axis];
    float size_contents = window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f;
    ScrollbarEx(bb, id, axis, &window->Scroll[axis], size_avail, size_contents, rounding_corners);
}